

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O0

csp_conn_t * csp_conn_find_dport(uint dport)

{
  long lVar1;
  csp_conn_t *conn;
  int i;
  uint dport_local;
  
  i = 0;
  while( true ) {
    if (7 < i) {
      return (csp_conn_t *)0x0;
    }
    lVar1 = (long)i;
    if (((arr_conn[lVar1].idin.dport == dport) && (arr_conn[lVar1].state == 1)) &&
       (arr_conn[lVar1].type == 0)) break;
    i = i + 1;
  }
  return arr_conn + lVar1;
}

Assistant:

csp_conn_t * csp_conn_find_dport(unsigned int dport) {

	for (int i = 0; i < CSP_CONN_MAX; i++) {
		csp_conn_t * conn = &arr_conn[i];

		/* Connection must match dport */
		if (conn->idin.dport != dport)
			continue;

		/* Connection must be open */
		if (conn->state != CONN_OPEN)
			continue;

		/* Connection must be client */
		if (conn->type != CONN_CLIENT)
			continue;

		/* All conditions found! */
		return conn;
	}

	return NULL;
}